

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moneystr.cpp
# Opt level: O0

string * FormatMoney_abi_cxx11_(CAmount n)

{
  long lVar1;
  reference pvVar2;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  int i;
  int nTrim;
  string *str;
  int64_t remainder;
  int64_t quotient;
  undefined7 in_stack_ffffffffffffff78;
  char in_stack_ffffffffffffff7f;
  undefined7 in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff87;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  reference in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar3;
  char *in_stack_ffffffffffffffb8;
  int local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<long,long>(in_stack_ffffffffffffffb8,(long *)in_RDI,(long *)in_RDI);
  local_30 = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  while( true ) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                        CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    uVar3 = false;
    if (*pvVar2 == '0') {
      in_stack_ffffffffffffff90 =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                      CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      in_stack_ffffffffffffff8f = IsDigit(in_stack_ffffffffffffff7f);
      uVar3 = in_stack_ffffffffffffff8f;
    }
    if ((bool)uVar3 == false) break;
    local_30 = local_30 + 1;
  }
  if (local_30 != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar3,in_stack_ffffffffffffff98),(size_type)in_stack_ffffffffffffff90,
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  }
  if (in_RSI < 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar3,in_stack_ffffffffffffff98),(size_type)in_stack_ffffffffffffff90,
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
               in_stack_ffffffffffffff87);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string FormatMoney(const CAmount n)
{
    // Note: not using straight sprintf here because we do NOT want
    // localized number formatting.
    static_assert(COIN > 1);
    int64_t quotient = n / COIN;
    int64_t remainder = n % COIN;
    if (n < 0) {
        quotient = -quotient;
        remainder = -remainder;
    }
    std::string str = strprintf("%d.%08d", quotient, remainder);

    // Right-trim excess zeros before the decimal point:
    int nTrim = 0;
    for (int i = str.size()-1; (str[i] == '0' && IsDigit(str[i-2])); --i)
        ++nTrim;
    if (nTrim)
        str.erase(str.size()-nTrim, nTrim);

    if (n < 0)
        str.insert(uint32_t{0}, 1, '-');
    return str;
}